

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::addEquation(Parser *this,Token *startToken,Identifier *name,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pFVar2;
  TokenizerPosition start;
  bool bVar3;
  TokenType TVar4;
  Token *pTVar5;
  size_t referenceIndex;
  FileEntry *entry;
  pointer pFVar6;
  vector<Token,_std::allocator<Token>_> tokens;
  FileTokenizer tok;
  TextFile f;
  vector<Token,_std::allocator<Token>_> local_448;
  FileTokenizer local_430;
  TextFile local_2f8;
  
  TextFile::TextFile(&local_2f8);
  TextFile::openMemory(&local_2f8,value);
  Tokenizer::Tokenizer(&local_430.super_Tokenizer);
  local_430.currentLine._M_dataplus._M_p = (pointer)&local_430.currentLine.field_2;
  local_430.currentLine._M_string_length = 0;
  local_430.currentLine.field_2._M_local_buf[0] = '\0';
  local_430.token.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
  .super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  paVar1 = &local_430.token.originalText.field_2;
  local_430.token.line = 0;
  local_430.token.column._0_5_ = 0;
  local_430.token.column._5_3_ = 0;
  local_430.token.type = Invalid;
  local_430.token.checked = false;
  local_430.token.originalText._M_string_length = 0;
  local_430.token.originalText.field_2._M_local_buf[0] = '\0';
  local_430.token.originalText._M_dataplus._M_p = (pointer)paVar1;
  FileTokenizer::init(&local_430,(EVP_PKEY_CTX *)&local_2f8);
  start.it._M_node = local_430.super_Tokenizer.position.it._M_node;
  do {
    if ((local_430.super_Tokenizer.position.it._M_node == (iterator)&local_430) ||
       (pTVar5 = Tokenizer::peekToken(&local_430.super_Tokenizer,0), pTVar5->type == Separator)) {
      Tokenizer::getTokens
                (&local_448,&local_430.super_Tokenizer,start,local_430.super_Tokenizer.position);
      referenceIndex = Tokenizer::addEquValue(&local_448);
      pFVar2 = (this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pFVar6 = (this->entries).
                    super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1)
      {
        Tokenizer::resetLookaheadCheckMarks(pFVar6->tokenizer);
      }
      SymbolTable::addEquation
                (&Global.symbolTable,name,Global.FileInfo.FileNum,Global.Section,referenceIndex);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_448);
      goto LAB_00147206;
    }
    pTVar5 = Tokenizer::nextToken(&local_430.super_Tokenizer);
    TVar4 = pTVar5->type;
    if (TVar4 == Identifier) {
      if (*(__index_type *)
           ((long)&(pTVar5->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) != '\x04') {
        __assert_fail("std::holds_alternative<Identifier>(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                      ,0x4d,"const Identifier &Token::identifierValue() const");
      }
      bVar3 = Identifier::operator==((Identifier *)&pTVar5->value,name);
      if (bVar3) {
        printError<Identifier>
                  (this,startToken,"Recursive equ definition for \"%s\" not allowed",name);
        goto LAB_00147206;
      }
      TVar4 = pTVar5->type;
    }
    if (TVar4 == Equ) {
      printError<>(this,startToken,"equ value must not contain another equ instance");
LAB_00147206:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430.token.originalText._M_dataplus._M_p != paVar1) {
        operator_delete(local_430.token.originalText._M_dataplus._M_p,
                        CONCAT71(local_430.token.originalText.field_2._M_allocated_capacity._1_7_,
                                 local_430.token.originalText.field_2._M_local_buf[0]) + 1);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)&local_430.token.value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430.currentLine._M_dataplus._M_p != &local_430.currentLine.field_2) {
        operator_delete(local_430.currentLine._M_dataplus._M_p,
                        CONCAT71(local_430.currentLine.field_2._M_allocated_capacity._1_7_,
                                 local_430.currentLine.field_2._M_local_buf[0]) + 1);
      }
      std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::~vector
                (&local_430.super_Tokenizer.replacements);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430.super_Tokenizer.invalidToken.originalText._M_dataplus._M_p !=
          &local_430.super_Tokenizer.invalidToken.originalText.field_2) {
        operator_delete(local_430.super_Tokenizer.invalidToken.originalText._M_dataplus._M_p,
                        local_430.super_Tokenizer.invalidToken.originalText.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)&local_430.super_Tokenizer.invalidToken.value);
      std::__cxx11::_List_base<Token,_std::allocator<Token>_>::_M_clear
                ((_List_base<Token,_std::allocator<Token>_> *)&local_430);
      TextFile::~TextFile(&local_2f8);
      return;
    }
  } while( true );
}

Assistant:

void Parser::addEquation(const Token& startToken, const Identifier& name, const std::string& value)
{
	// parse value string
	TextFile f;
	f.openMemory(value);

	FileTokenizer tok;
	tok.init(&f);

	TokenizerPosition start = tok.getPosition();
	while (!tok.atEnd() && tok.peekToken().type != TokenType::Separator)
	{
		const Token& token = tok.nextToken();
		if (token.type == TokenType::Identifier && token.identifierValue() == name)
		{
			printError(startToken, "Recursive equ definition for \"%s\" not allowed",name);
			return;
		}

		if (token.type == TokenType::Equ)
		{
			printError(startToken, "equ value must not contain another equ instance");
			return;
		}
	}

	// extract tokens
	TokenizerPosition end = tok.getPosition();
	std::vector<Token> tokens = tok.getTokens(start, end);
	size_t index = Tokenizer::addEquValue(tokens);

	for (FileEntry& entry : entries)
		entry.tokenizer->resetLookaheadCheckMarks();

	// register equation
	Global.symbolTable.addEquation(name, Global.FileInfo.FileNum, Global.Section, index);
}